

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void metaiterator_advance(char **title,char **value)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = *title;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    pcVar3 = (char *)0x0;
  }
  else {
    do {
      pcVar2 = pcVar1;
      *value = pcVar2;
      pcVar1 = pcVar2 + 1;
    } while (*pcVar2 != '\0');
    *value = pcVar1;
    pcVar3 = (char *)0x0;
    if (*pcVar1 == '=') {
      pcVar3 = pcVar2 + 2;
    }
  }
  *value = pcVar3;
  return;
}

Assistant:

void metaiterator_advance(const char *&title, const char *&value)
{
    if(!title || !*title) {
        value = NULL;
        return;
    }

    //Try to find "\0=" after title string
    value = title;
    while(*value)
        ++value;
    if(*++value != '=')
        value = NULL;
    else
        value++;
}